

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::yyjson_mut_merge_patch
          (yyjson_mut_doc *doc,yyjson_mut_val *orig,yyjson_mut_val *patch)

{
  yyjson_val_pool *pool;
  long lVar1;
  yyjson_mut_val *__s2;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  yyjson_mut_val *pyVar4;
  ulong uVar5;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *pyVar7;
  yyjson_mut_val *pyVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  yyjson_mut_val *pyVar13;
  bool bVar14;
  yyjson_mut_val local_orig;
  
  if ((patch == (yyjson_mut_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    if (patch == (yyjson_mut_val *)0x0 || doc == (yyjson_mut_doc *)0x0) {
      return (yyjson_mut_val *)0x0;
    }
    pyVar7 = unsafe_yyjson_mut_val_mut_copy(doc,patch);
    return pyVar7;
  }
  pyVar7 = orig;
  if (doc != (yyjson_mut_doc *)0x0) {
    pool = &doc->val_pool;
    if ((doc->val_pool).end == (doc->val_pool).cur) {
      pyVar7 = (yyjson_mut_val *)&doc->alc;
      bVar14 = unsafe_yyjson_val_pool_grow(pool,(yyjson_alc *)pyVar7,1);
      if (bVar14) goto LAB_00d0d4f8;
      pyVar13 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00d0d4f8:
      pyVar13 = pool->cur;
      pool->cur = pyVar13 + 1;
    }
    if (pyVar13 != (yyjson_mut_val *)0x0) {
      pyVar13->tag = 7;
      goto LAB_00d0d514;
    }
  }
  pyVar13 = (yyjson_mut_val *)0x0;
LAB_00d0d514:
  if (pyVar13 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  local_orig.tag = 0;
  local_orig.uni.u64 = 0;
  local_orig.next = (yyjson_mut_val *)0x0;
  if ((orig == (yyjson_mut_val *)0x0) || ((~(uint)orig->tag & 7) != 0)) {
    local_orig.tag = pyVar13->tag;
    local_orig.uni = pyVar13->uni;
    orig = &local_orig;
  }
  if (orig != &local_orig) {
    if ((~(uint)orig->tag & 7) == 0) {
      uVar9 = orig->tag >> 8;
    }
    else {
      uVar9 = 0;
    }
    if (uVar9 == 0) {
      pyVar6 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar6 = *(yyjson_mut_val **)(*(long *)((orig->uni).u64 + 0x10) + 0x10);
    }
    if (pyVar6 == (yyjson_mut_val *)0x0) {
      pyVar8 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar8 = pyVar6->next;
    }
    if (uVar9 != 0) {
      uVar5 = 0;
      do {
        if ((patch == (yyjson_mut_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
          uVar12 = 0;
        }
        else {
          uVar12 = patch->tag >> 8;
        }
        pyVar4 = (yyjson_mut_val *)(pyVar6->uni).ptr;
        if ((pyVar4 == (yyjson_mut_val *)0x0) || (uVar12 == 0)) {
LAB_00d0d650:
          uVar3 = 0;
        }
        else {
          uVar10 = pyVar6->tag >> 8;
          puVar11 = (ulong *)(patch->uni).u64;
          bVar14 = false;
          do {
            puVar11 = *(ulong **)(puVar11[2] + 0x10);
            uVar3 = *puVar11 >> 8;
            if (uVar3 == uVar10) {
              pyVar7 = pyVar4;
              iVar2 = bcmp((void *)puVar11[1],pyVar4,uVar10);
              uVar3 = CONCAT44(extraout_var,iVar2);
              if (iVar2 == 0) {
                uVar3 = puVar11[2];
                break;
              }
            }
            uVar12 = uVar12 - 1;
            bVar14 = uVar12 == 0;
          } while (!bVar14);
          if (bVar14) goto LAB_00d0d650;
        }
        if (uVar3 == 0) {
          if (doc == (yyjson_mut_doc *)0x0) {
            pyVar6 = (yyjson_mut_val *)0x0;
            pyVar4 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar6 = unsafe_yyjson_mut_val_mut_copy(doc,pyVar6);
            pyVar4 = (yyjson_mut_val *)0x0;
            if (pyVar8 != (yyjson_mut_val *)0x0) {
              pyVar4 = unsafe_yyjson_mut_val_mut_copy(doc,pyVar8);
            }
          }
          if ((~(uint)pyVar13->tag & 7) == 0) {
            if (pyVar6 == (yyjson_mut_val *)0x0) {
              bVar14 = false;
            }
            else {
              bVar14 = (pyVar6->tag & 7) == 5;
            }
            bVar14 = (bool)(pyVar4 != (yyjson_mut_val *)0x0 & bVar14);
          }
          else {
            bVar14 = false;
          }
          if (!bVar14) {
            return (yyjson_mut_val *)0x0;
          }
          uVar12 = pyVar13->tag;
          pyVar7 = pyVar6;
          if (0xff < uVar12) {
            lVar1 = *(long *)((pyVar13->uni).u64 + 0x10);
            pyVar7 = *(yyjson_mut_val **)(lVar1 + 0x10);
            *(yyjson_mut_val **)(lVar1 + 0x10) = pyVar6;
          }
          pyVar4->next = pyVar7;
          pyVar6->next = pyVar4;
          (pyVar13->uni).str = (char *)pyVar6;
          pyVar13->tag = (uVar12 & 0xff) + (uVar12 & 0xffffffffffffff00) + 0x100;
          if (!bVar14) {
            return (yyjson_mut_val *)0x0;
          }
        }
        uVar5 = uVar5 + 1;
        pyVar6 = pyVar8->next;
        pyVar8 = pyVar6->next;
      } while (uVar5 != uVar9);
    }
  }
  if ((patch == (yyjson_mut_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    uVar9 = 0;
  }
  else {
    uVar9 = patch->tag >> 8;
  }
  if (uVar9 == 0) {
    pyVar6 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar6 = *(yyjson_mut_val **)(*(long *)((patch->uni).u64 + 0x10) + 0x10);
  }
  if (pyVar6 == (yyjson_mut_val *)0x0) {
    pyVar8 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar8 = pyVar6->next;
  }
  if (uVar9 == 0) {
    return pyVar13;
  }
  uVar5 = 0;
  do {
    if ((pyVar8->tag & 7) != 2) {
      if (doc == (yyjson_mut_doc *)0x0) {
        pyVar4 = (yyjson_mut_val *)0x0;
      }
      else {
        pyVar4 = (yyjson_mut_val *)0x0;
        if (pyVar6 != (yyjson_mut_val *)0x0) {
          pyVar7 = pyVar6;
          pyVar4 = unsafe_yyjson_mut_val_mut_copy(doc,pyVar6);
        }
      }
      __s2 = (yyjson_mut_val *)(pyVar6->uni).ptr;
      if ((~(uint)orig->tag & 7) == 0) {
        uVar12 = orig->tag >> 8;
      }
      else {
        uVar12 = 0;
      }
      if ((__s2 == (yyjson_mut_val *)0x0) || (uVar12 == 0)) {
LAB_00d0d875:
        pyVar7 = (yyjson_mut_val *)0x0;
      }
      else {
        uVar10 = pyVar6->tag >> 8;
        puVar11 = (ulong *)(orig->uni).u64;
        bVar14 = false;
        do {
          puVar11 = *(ulong **)(puVar11[2] + 0x10);
          if ((*puVar11 >> 8 == uVar10) &&
             (pyVar7 = __s2, iVar2 = bcmp((void *)puVar11[1],__s2,uVar10), iVar2 == 0)) {
            pyVar7 = (yyjson_mut_val *)puVar11[2];
            break;
          }
          uVar12 = uVar12 - 1;
          bVar14 = uVar12 == 0;
        } while (!bVar14);
        if (bVar14) goto LAB_00d0d875;
      }
      pyVar6 = yyjson_mut_merge_patch(doc,pyVar7,pyVar8);
      if ((~(uint)pyVar13->tag & 7) == 0) {
        if (pyVar4 == (yyjson_mut_val *)0x0) {
          bVar14 = false;
        }
        else {
          bVar14 = (pyVar4->tag & 7) == 5;
        }
        bVar14 = (bool)(pyVar6 != (yyjson_mut_val *)0x0 & bVar14);
      }
      else {
        bVar14 = false;
      }
      if (!bVar14) {
        return (yyjson_mut_val *)0x0;
      }
      uVar12 = pyVar13->tag;
      pyVar7 = pyVar4;
      if (0xff < uVar12) {
        lVar1 = *(long *)((pyVar13->uni).u64 + 0x10);
        pyVar7 = *(yyjson_mut_val **)(lVar1 + 0x10);
        *(yyjson_mut_val **)(lVar1 + 0x10) = pyVar4;
      }
      pyVar6->next = pyVar7;
      pyVar4->next = pyVar6;
      (pyVar13->uni).str = (char *)pyVar4;
      pyVar13->tag = (uVar12 & 0xff) + (uVar12 & 0xffffffffffffff00) + 0x100;
      if (!bVar14) {
        return (yyjson_mut_val *)0x0;
      }
    }
    uVar5 = uVar5 + 1;
    pyVar6 = pyVar8->next;
    pyVar8 = pyVar6->next;
    if (uVar5 == uVar9) {
      return pyVar13;
    }
  } while( true );
}

Assistant:

yyjson_mut_val *yyjson_mut_merge_patch(yyjson_mut_doc *doc,
                                       yyjson_mut_val *orig,
                                       yyjson_mut_val *patch) {
    usize idx, max;
    yyjson_mut_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_mut_is_obj(patch))) {
        return yyjson_mut_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_mut_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_mut_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_mut_obj_getn(patch,
                                            unsafe_yyjson_get_str(key),
                                            unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_mut_val_mut_copy(doc, key);
                mut_val = yyjson_mut_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_mut_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_mut_val_mut_copy(doc, key);
        orig_val = yyjson_mut_obj_getn(orig,
                                       unsafe_yyjson_get_str(key),
                                       unsafe_yyjson_get_len(key));
        merged_val = yyjson_mut_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}